

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Imputer::Imputer(Imputer *this)

{
  Imputer *pIVar1;
  Imputer *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Imputer_00624fe8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  ImputedValueUnion::ImputedValueUnion
            ((ImputedValueUnion *)&(this->ImputedValue_).imputedstringvalue_);
  ReplaceValueUnion::ReplaceValueUnion
            ((ReplaceValueUnion *)&(this->ReplaceValue_).replacestringvalue_);
  pIVar1 = internal_default_instance();
  if (this != pIVar1) {
    protobuf_Imputer_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

Imputer::Imputer()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_Imputer_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.Imputer)
}